

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFUnit.cpp
# Opt level: O3

Expected<llvm::DWARFDebugRnglistTable> *
parseRngListTableHeader
          (Expected<llvm::DWARFDebugRnglistTable> *__return_storage_ptr__,DWARFDataExtractor *DA,
          uint64_t Offset,DwarfFormat Format)

{
  size_t *Err;
  map<unsigned_long,_llvm::DWARFDebugRnglist,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_llvm::DWARFDebugRnglist>_>_>
  *pmVar1;
  ulong uVar2;
  char *Fmt;
  Expected<llvm::DWARFDebugRnglistTable> *extraout_RAX;
  Expected<llvm::DWARFDebugRnglistTable> *pEVar3;
  Expected<llvm::DWARFDebugRnglistTable> *extraout_RAX_00;
  Expected<llvm::DWARFDebugRnglistTable> *extraout_RAX_01;
  _Base_ptr p_Var4;
  _Base_ptr *pp_Var5;
  undefined4 uVar6;
  _Base_ptr p_Var7;
  error_code EC;
  AlignedCharArrayUnion<std::unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>_>
  AStack_d0;
  DWARFDebugRnglistTable Table;
  Error local_30;
  uint64_t local_28;
  uint64_t Offset_local;
  
  local_28 = Offset;
  if (Offset != 0) {
    uVar2 = 0xc;
    if (Format != DWARF32) {
      if (Format != DWARF64) {
        llvm::llvm_unreachable_internal
                  ("Invalid DWARF format (expected DWARF32 or DWARF64",
                   "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/DebugInfo/DWARF/DWARFListTable.h"
                   ,0x73);
      }
      uVar2 = 0x14;
    }
    local_28 = Offset - uVar2;
    if (Offset < uVar2) {
      local_28 = Offset;
      Fmt = (char *)std::_V2::generic_category();
      Err = &Table.super_DWARFListTableBase<llvm::DWARFDebugRnglist>.HeaderString.Length;
      EC._M_cat = (error_category *)0x16;
      EC._0_8_ = Err;
      llvm::createStringError<unsigned_long>
                (EC,Fmt,(unsigned_long *)
                        "Did not detect a valid range list table with base = 0x%lx\n");
      llvm::Expected<llvm::DWARFDebugRnglistTable>::Expected(__return_storage_ptr__,(Error *)Err);
      if ((long *)(Table.super_DWARFListTableBase<llvm::DWARFDebugRnglist>.HeaderString.Length &
                  0xfffffffffffffffe) == (long *)0x0) {
        return extraout_RAX;
      }
      pEVar3 = (Expected<llvm::DWARFDebugRnglistTable> *)
               (**(code **)(*(long *)(Table.super_DWARFListTableBase<llvm::DWARFDebugRnglist>.
                                      HeaderString.Length & 0xfffffffffffffffe) + 8))();
      return pEVar3;
    }
  }
  pmVar1 = &Table.super_DWARFListTableBase<llvm::DWARFDebugRnglist>.ListMap;
  AStack_d0.buffer[0] = '\0';
  AStack_d0.buffer[1] = '\0';
  AStack_d0.buffer[2] = '\0';
  AStack_d0.buffer[3] = '\0';
  AStack_d0.buffer[4] = '\0';
  AStack_d0.buffer[5] = '\0';
  AStack_d0.buffer[6] = '\0';
  AStack_d0.buffer[7] = '\0';
  Table.super_DWARFListTableBase<llvm::DWARFDebugRnglist>.Header.HeaderData.Version = 0;
  Table.super_DWARFListTableBase<llvm::DWARFDebugRnglist>.Header.HeaderData.AddrSize = '\0';
  Table.super_DWARFListTableBase<llvm::DWARFDebugRnglist>.Header.HeaderData.SegSize = '\0';
  Table.super_DWARFListTableBase<llvm::DWARFDebugRnglist>.Header.HeaderData.OffsetEntryCount = 0;
  Table.super_DWARFListTableBase<llvm::DWARFDebugRnglist>.Header.Offsets.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  Table.super_DWARFListTableBase<llvm::DWARFDebugRnglist>.Header.Offsets.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  Table.super_DWARFListTableBase<llvm::DWARFDebugRnglist>.Header.HeaderOffset =
       (uint64_t)anon_var_dwarf_403c8b2;
  Table.super_DWARFListTableBase<llvm::DWARFDebugRnglist>.Header.SectionName.Data = (char *)0xf;
  Table.super_DWARFListTableBase<llvm::DWARFDebugRnglist>.Header.SectionName.Length =
       (long)"DW_TAG_generic_subrange" + 0x12;
  Table.super_DWARFListTableBase<llvm::DWARFDebugRnglist>.Header.ListTypeString.Data = (char *)0x5;
  Table.super_DWARFListTableBase<llvm::DWARFDebugRnglist>.ListMap._M_t._M_impl._0_4_ = 0;
  Table.super_DWARFListTableBase<llvm::DWARFDebugRnglist>.ListMap._M_t._M_impl.super__Rb_tree_header
  ._M_header._M_color = _S_red;
  Table.super_DWARFListTableBase<llvm::DWARFDebugRnglist>.ListMap._M_t._M_impl.super__Rb_tree_header
  ._M_header._4_4_ = 0;
  Table.super_DWARFListTableBase<llvm::DWARFDebugRnglist>.ListMap._M_t._M_impl.super__Rb_tree_header
  ._M_header._M_right = (_Base_ptr)0x0;
  Table.super_DWARFListTableBase<llvm::DWARFDebugRnglist>.ListMap._M_t._M_impl.super__Rb_tree_header
  ._M_node_count = (long)"DIE address ranges are not contained in its parent\'s ranges:" + 0x35;
  Table.super_DWARFListTableBase<llvm::DWARFDebugRnglist>.HeaderString.Data = (char *)0x7;
  Table.super_DWARFListTableBase<llvm::DWARFDebugRnglist>.ListMap._M_t._M_impl.super__Rb_tree_header
  ._M_header._M_parent = (_Base_ptr)pmVar1;
  Table.super_DWARFListTableBase<llvm::DWARFDebugRnglist>.ListMap._M_t._M_impl.super__Rb_tree_header
  ._M_header._M_left = (_Base_ptr)pmVar1;
  llvm::DWARFListTableHeader::extract
            ((DWARFListTableHeader *)&Offset_local,*DA,(uint64_t *)&AStack_d0);
  if (Offset_local < 2) {
    __return_storage_ptr__->field_0x98 = __return_storage_ptr__->field_0x98 & 0xfe;
    *&(__return_storage_ptr__->field_0).ErrorStorage.buffer = AStack_d0.buffer;
    *(uint64_t *)((long)&__return_storage_ptr__->field_0 + 8) =
         Table.super_DWARFListTableBase<llvm::DWARFDebugRnglist>.Header.HeaderData.Length;
    *(undefined8 *)((long)&__return_storage_ptr__->field_0 + 0x10) =
         Table.super_DWARFListTableBase<llvm::DWARFDebugRnglist>.Header.HeaderData._8_8_;
    *(pointer *)((long)&__return_storage_ptr__->field_0 + 0x18) =
         Table.super_DWARFListTableBase<llvm::DWARFDebugRnglist>.Header.Offsets.
         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_start;
    *(pointer *)((long)&__return_storage_ptr__->field_0 + 0x20) =
         Table.super_DWARFListTableBase<llvm::DWARFDebugRnglist>.Header.Offsets.
         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_finish;
    Table.super_DWARFListTableBase<llvm::DWARFDebugRnglist>.Header.HeaderData.Version = 0;
    Table.super_DWARFListTableBase<llvm::DWARFDebugRnglist>.Header.HeaderData.AddrSize = '\0';
    Table.super_DWARFListTableBase<llvm::DWARFDebugRnglist>.Header.HeaderData.SegSize = '\0';
    Table.super_DWARFListTableBase<llvm::DWARFDebugRnglist>.Header.HeaderData.OffsetEntryCount = 0;
    Table.super_DWARFListTableBase<llvm::DWARFDebugRnglist>.Header.Offsets.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    Table.super_DWARFListTableBase<llvm::DWARFDebugRnglist>.Header.Offsets.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    *(size_t *)((long)&__return_storage_ptr__->field_0 + 0x48) =
         Table.super_DWARFListTableBase<llvm::DWARFDebugRnglist>.Header.SectionName.Length;
    *(char **)((long)&__return_storage_ptr__->field_0 + 0x50) =
         Table.super_DWARFListTableBase<llvm::DWARFDebugRnglist>.Header.ListTypeString.Data;
    *(uint64_t *)((long)&__return_storage_ptr__->field_0 + 0x38) =
         Table.super_DWARFListTableBase<llvm::DWARFDebugRnglist>.Header.HeaderOffset;
    *(char **)((long)&__return_storage_ptr__->field_0 + 0x40) =
         Table.super_DWARFListTableBase<llvm::DWARFDebugRnglist>.Header.SectionName.Data;
    *(pointer *)((long)&__return_storage_ptr__->field_0 + 0x28) =
         Table.super_DWARFListTableBase<llvm::DWARFDebugRnglist>.Header.Offsets.
         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    *(undefined8 *)((long)&__return_storage_ptr__->field_0 + 0x30) =
         Table.super_DWARFListTableBase<llvm::DWARFDebugRnglist>.Header._40_8_;
    p_Var4 = (_Base_ptr)((long)&__return_storage_ptr__->field_0 + 0x60);
    if (Table.super_DWARFListTableBase<llvm::DWARFDebugRnglist>.ListMap._M_t._M_impl.
        super__Rb_tree_header._M_header._0_8_ == 0) {
      *(undefined8 *)((long)&__return_storage_ptr__->field_0 + 0x68) = 0;
      pp_Var5 = (_Base_ptr *)((long)&__return_storage_ptr__->field_0 + 0x80);
      uVar6 = 0;
      p_Var7 = p_Var4;
    }
    else {
      pp_Var5 = (_Base_ptr *)
                ((long)&Table.super_DWARFListTableBase<llvm::DWARFDebugRnglist>.ListMap._M_t._M_impl
                        .super__Rb_tree_header._M_header + 0x18);
      *(undefined8 *)((long)&__return_storage_ptr__->field_0 + 0x68) =
           Table.super_DWARFListTableBase<llvm::DWARFDebugRnglist>.ListMap._M_t._M_impl.
           super__Rb_tree_header._M_header._0_8_;
      *(_Base_ptr *)
       (Table.super_DWARFListTableBase<llvm::DWARFDebugRnglist>.ListMap._M_t._M_impl.
        super__Rb_tree_header._M_header._0_8_ + 8) = p_Var4;
      *(_Base_ptr *)((long)&__return_storage_ptr__->field_0 + 0x80) =
           Table.super_DWARFListTableBase<llvm::DWARFDebugRnglist>.ListMap._M_t._M_impl.
           super__Rb_tree_header._M_header._M_right;
      Table.super_DWARFListTableBase<llvm::DWARFDebugRnglist>.ListMap._M_t._M_impl.
      super__Rb_tree_header._M_header._M_color = _S_red;
      Table.super_DWARFListTableBase<llvm::DWARFDebugRnglist>.ListMap._M_t._M_impl.
      super__Rb_tree_header._M_header._4_4_ = 0;
      p_Var4 = Table.super_DWARFListTableBase<llvm::DWARFDebugRnglist>.ListMap._M_t._M_impl.
               super__Rb_tree_header._M_header._M_parent;
      p_Var7 = Table.super_DWARFListTableBase<llvm::DWARFDebugRnglist>.ListMap._M_t._M_impl.
               super__Rb_tree_header._M_header._M_left;
      uVar6 = Table.super_DWARFListTableBase<llvm::DWARFDebugRnglist>.ListMap._M_t._M_impl._0_4_;
      Table.super_DWARFListTableBase<llvm::DWARFDebugRnglist>.ListMap._M_t._M_impl.
      super__Rb_tree_header._M_header._M_parent = (_Base_ptr)pmVar1;
      Table.super_DWARFListTableBase<llvm::DWARFDebugRnglist>.ListMap._M_t._M_impl.
      super__Rb_tree_header._M_header._M_left = (_Base_ptr)pmVar1;
    }
    *(_Base_ptr *)((long)&__return_storage_ptr__->field_0 + 0x70) = p_Var4;
    *(_Base_ptr *)((long)&__return_storage_ptr__->field_0 + 0x78) = p_Var7;
    *pp_Var5 = (_Base_ptr)0x0;
    *(undefined4 *)((long)&__return_storage_ptr__->field_0 + 0x60) = uVar6;
    *(size_t *)((long)&__return_storage_ptr__->field_0 + 0x88) =
         Table.super_DWARFListTableBase<llvm::DWARFDebugRnglist>.ListMap._M_t._M_impl.
         super__Rb_tree_header._M_node_count;
    *(char **)((long)&__return_storage_ptr__->field_0 + 0x90) =
         Table.super_DWARFListTableBase<llvm::DWARFDebugRnglist>.HeaderString.Data;
  }
  else {
    local_30.Payload = (ErrorInfoBase *)(Offset_local | 1);
    Offset_local = 0;
    llvm::Expected<llvm::DWARFDebugRnglistTable>::Expected(__return_storage_ptr__,&local_30);
    if ((long *)((ulong)local_30.Payload & 0xfffffffffffffffe) != (long *)0x0) {
      (**(code **)(*(long *)((ulong)local_30.Payload & 0xfffffffffffffffe) + 8))();
    }
    if ((long *)(Offset_local & 0xfffffffffffffffe) != (long *)0x0) {
      (**(code **)(*(long *)(Offset_local & 0xfffffffffffffffe) + 8))();
    }
  }
  std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_llvm::DWARFDebugRnglist>,_std::_Select1st<std::pair<const_unsigned_long,_llvm::DWARFDebugRnglist>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_llvm::DWARFDebugRnglist>_>_>
  ::~_Rb_tree((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_llvm::DWARFDebugRnglist>,_std::_Select1st<std::pair<const_unsigned_long,_llvm::DWARFDebugRnglist>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_llvm::DWARFDebugRnglist>_>_>
               *)&Table.super_DWARFListTableBase<llvm::DWARFDebugRnglist>.Header.ListTypeString.
                  Length);
  pEVar3 = extraout_RAX_00;
  if (Table.super_DWARFListTableBase<llvm::DWARFDebugRnglist>.Header.HeaderData._8_8_ != 0) {
    operator_delete((void *)Table.super_DWARFListTableBase<llvm::DWARFDebugRnglist>.Header.
                            HeaderData._8_8_,
                    (long)Table.super_DWARFListTableBase<llvm::DWARFDebugRnglist>.Header.Offsets.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    Table.super_DWARFListTableBase<llvm::DWARFDebugRnglist>.Header.HeaderData._8_8_)
    ;
    pEVar3 = extraout_RAX_01;
  }
  return pEVar3;
}

Assistant:

static Expected<DWARFDebugRnglistTable>
parseRngListTableHeader(DWARFDataExtractor &DA, uint64_t Offset,
                        DwarfFormat Format) {
  // We are expected to be called with Offset 0 or pointing just past the table
  // header. Correct Offset in the latter case so that it points to the start
  // of the header.
  if (Offset > 0) {
    uint64_t HeaderSize = DWARFListTableHeader::getHeaderSize(Format);
    if (Offset < HeaderSize)
      return createStringError(errc::invalid_argument, "Did not detect a valid"
                               " range list table with base = 0x%" PRIx64 "\n",
                               Offset);
    Offset -= HeaderSize;
  }
  llvm::DWARFDebugRnglistTable Table;
  if (Error E = Table.extractHeaderAndOffsets(DA, &Offset))
    return std::move(E);
  return Table;
}